

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O0

Raster * rw::Raster::convertTexToCurrentPlatform(Raster *ras)

{
  int32 iVar1;
  Image *pIVar2;
  Raster *this;
  int local_58;
  int i;
  int numLevels;
  Raster *newras;
  Image *img;
  int32 format;
  int32 depth;
  int32 height;
  int32 width;
  Raster *newras_3;
  Raster *newras_2;
  Raster *newras_1;
  Raster *ras_local;
  
  ras_local = ras;
  if (((ras->platform != rw::platform) && ((ras->platform != 8 || (rw::platform != 9)))) &&
     ((ras->platform != 9 || (rw::platform != 8)))) {
    newras_1 = ras;
    if (((ras->platform == 8) || (ras->platform == 9)) && (rw::platform == 0xc)) {
      newras_2 = d3d_to_gl3(ras);
      if (newras_2 != (Raster *)0x0) {
        destroy(newras_1);
        return newras_2;
      }
      newras_2 = (Raster *)0x0;
    }
    else if ((ras->platform == 5) && ((rw::platform == 9 || (rw::platform == 8)))) {
      newras_3 = xbox_to_d3d(ras);
      if (newras_3 != (Raster *)0x0) {
        destroy(newras_1);
        return newras_3;
      }
      newras_3 = (Raster *)0x0;
    }
    else if ((ras->platform == 5) && (rw::platform == 0xc)) {
      _height = xbox_to_gl3(ras);
      if (_height != (Raster *)0x0) {
        destroy(newras_1);
        return _height;
      }
      _height = (Raster *)0x0;
    }
    pIVar2 = toImage(newras_1);
    Image::unpalettize(pIVar2,false);
    imageFindRasterFormat(pIVar2,4,&depth,&format,(int32 *)((long)&img + 4),(int32 *)&img,0);
    img._0_4_ = newras_1->format & 0x9000U | (uint)img;
    this = create(depth,format,img._4_4_,(uint)img,0);
    setFromImage(this,pIVar2,0);
    Image::destroy(pIVar2);
    iVar1 = getNumLevels(newras_1);
    for (local_58 = 1; local_58 < iVar1; local_58 = local_58 + 1) {
      lock(newras_1,local_58,2);
      pIVar2 = toImage(newras_1);
      Image::unpalettize(pIVar2,false);
      lock(this,local_58,5);
      setFromImage(this,pIVar2,0);
      unlock(this,local_58);
      unlock(newras_1,local_58);
    }
    destroy(newras_1);
    ras_local = this;
  }
  return ras_local;
}

Assistant:

rw::Raster*
Raster::convertTexToCurrentPlatform(rw::Raster *ras)
{
	using namespace rw;

	if(ras->platform == rw::platform)
		return ras;
	// compatible platforms
	if((ras->platform == PLATFORM_D3D8 && rw::platform == PLATFORM_D3D9) ||
	   (ras->platform == PLATFORM_D3D9 && rw::platform == PLATFORM_D3D8))
		return ras;

	// special cased conversion for DXT
	if((ras->platform == PLATFORM_D3D8 || ras->platform == PLATFORM_D3D9) && rw::platform == PLATFORM_GL3){
		Raster *newras = d3d_to_gl3(ras);
		if(newras){
			ras->destroy();
			return newras;
		}
	}else if(ras->platform == PLATFORM_XBOX && (rw::platform == PLATFORM_D3D9 || rw::platform == PLATFORM_D3D8)){
		Raster *newras = xbox_to_d3d(ras);
		if(newras){
			ras->destroy();
			return newras;
		}
	}else if(ras->platform == PLATFORM_XBOX && rw::platform == PLATFORM_GL3){
		Raster *newras = xbox_to_gl3(ras);
		if(newras){
			ras->destroy();
			return newras;
		}
	}

	// fall back to going through Image directly
	int32 width, height, depth, format;
	Image *img = ras->toImage();
	// TODO: maybe don't *always* do this?
	img->unpalettize();
	Raster::imageFindRasterFormat(img, Raster::TEXTURE, &width, &height, &depth, &format);
	format |= ras->format & (Raster::MIPMAP | Raster::AUTOMIPMAP);
	Raster *newras = Raster::create(width, height, depth, format);
	newras->setFromImage(img);
	img->destroy();
	int numLevels = ras->getNumLevels();
	for(int i = 1; i < numLevels; i++){
		ras->lock(i, Raster::LOCKREAD);
		img = ras->toImage();
		// TODO: maybe don't *always* do this?
		img->unpalettize();
		newras->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		newras->setFromImage(img);
		newras->unlock(i);
		ras->unlock(i);
	}
	ras->destroy();
	ras = newras;
	return ras;
}